

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

void envy_bios_print_conn(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_conn_entry *peVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar2 = (bios->conn).offset;
  if ((mask >> 0x14 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->conn).version;
  uVar7 = (ulong)(bVar1 >> 4);
  uVar5 = (ulong)(bVar1 & 0xf);
  if ((bios->conn).valid != '\0') {
    fprintf((FILE *)out,"CONN table at 0x%04x version %d.%d\n",(ulong)uVar2,uVar7,uVar5);
    envy_bios_dump_hex(bios,out,(uint)(bios->conn).offset,(uint)(bios->conn).hlen,mask);
    if ((bios->conn).entriesnum != '\0') {
      lVar6 = 9;
      uVar7 = 0;
      do {
        peVar3 = (bios->conn).entries;
        bVar1 = *(byte *)((long)peVar3 + lVar6 + -7);
        if (((mask >> 0x1e & 1) != 0) || (bVar1 != 0xff)) {
          pcVar4 = find_enum(conn_types,(uint)bVar1);
          fprintf((FILE *)out,"CONN %d:",uVar7 & 0xffffffff);
          fprintf((FILE *)out," type 0x%02x [%s] tag %d",(ulong)*(byte *)((long)peVar3 + lVar6 + -7)
                  ,pcVar4,(ulong)*(byte *)((long)peVar3 + lVar6 + -6));
          if (*(char *)((long)peVar3 + lVar6 + -5) != -1) {
            fprintf((FILE *)out," HPD_%d");
          }
          if (*(char *)((long)peVar3 + lVar6 + -4) != -1) {
            fprintf((FILE *)out," DP_EXT_%d");
          }
          if (*(char *)((long)peVar3 + lVar6 + -3) != '\0') {
            fprintf((FILE *)out," unk02_2 0x%02x");
          }
          if (*(char *)((long)peVar3 + lVar6 + -2) != '\0') {
            fprintf((FILE *)out," unk02_4 0x%02x");
          }
          if (*(char *)((long)peVar3 + lVar6 + -1) != '\0') {
            fprintf((FILE *)out," unk02_7 0x%02x");
          }
          if (*(char *)((long)&peVar3->offset + lVar6) != '\0') {
            fprintf((FILE *)out," unk03_3 0x%02x");
          }
          fputc(10,(FILE *)out);
        }
        envy_bios_dump_hex(bios,out,(uint)*(ushort *)((long)peVar3 + lVar6 + -9),
                           (uint)(bios->conn).rlen,mask);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 10;
      } while (uVar7 < (bios->conn).entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse CONN table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar7,
          uVar5);
  return;
}

Assistant:

void envy_bios_print_conn (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset || !(mask & ENVY_BIOS_PRINT_CONN))
		return;
	if (!conn->valid) {
		fprintf(out, "Failed to parse CONN table at 0x%04x version %d.%d\n\n", conn->offset, conn->version >> 4, conn->version & 0xf);
		return;
	}
	fprintf(out, "CONN table at 0x%04x version %d.%d\n", conn->offset, conn->version >> 4, conn->version & 0xf);
	envy_bios_dump_hex(bios, out, conn->offset, conn->hlen, mask);
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		if (entry->type != ENVY_BIOS_CONN_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(conn_types, entry->type);
			fprintf(out, "CONN %d:", i);
			fprintf(out, " type 0x%02x [%s] tag %d", entry->type, typename, entry->tag);
			if (entry->hpd != -1)
				fprintf(out, " HPD_%d", entry->hpd);
			if (entry->dp_ext != -1)
				fprintf(out, " DP_EXT_%d", entry->dp_ext);
			if (entry->unk02_2)
				fprintf(out, " unk02_2 0x%02x", entry->unk02_2);
			if (entry->unk02_4)
				fprintf(out, " unk02_4 0x%02x", entry->unk02_4);
			if (entry->unk02_7)
				fprintf(out, " unk02_7 0x%02x", entry->unk02_7);
			if (entry->unk03_3)
				fprintf(out, " unk03_3 0x%02x", entry->unk03_3);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, conn->rlen, mask);
	}
	fprintf(out, "\n");
}